

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O0

int Dau_PrintStats(int nNodes,int nInputs,int nVars,Vec_Int_t *vNodSup,int iStart,int iStop,
                  word nSteps,int Count2,abctime clk)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  int nNew;
  int iStop_local;
  int iStart_local;
  Vec_Int_t *vNodSup_local;
  int nVars_local;
  int nInputs_local;
  int nNodes_local;
  
  printf("N =%2d | ",(ulong)(uint)nNodes);
  printf("C =%12.0f  ",(double)(long)nSteps);
  printf("New%d =%10d  ",(ulong)(uint)nInputs,(ulong)(uint)(iStop - iStart));
  printf("All%d =%10d | ",(ulong)(uint)nInputs,(ulong)(uint)iStop);
  iVar1 = Dau_CountFuncs(vNodSup,iStart,iStop,nVars);
  printf("New%d =%8d  ");
  uVar2 = Dau_CountFuncs(vNodSup,0,iStop,nVars);
  printf("All%d =%8d  ",(ulong)(uint)nVars,(ulong)uVar2);
  printf("Two =%6d ",(ulong)(uint)Count2);
  aVar3 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar3 - clk) * 1.0) / 1000000.0);
  fflush(_stdout);
  return iVar1;
}

Assistant:

int Dau_PrintStats( int nNodes, int nInputs, int nVars, Vec_Int_t * vNodSup, int iStart, int iStop, word nSteps, int Count2, abctime clk )
{
    int nNew;
    printf("N =%2d | ",      nNodes );
    printf("C =%12.0f  ",    (double)(iword)nSteps );
    printf("New%d =%10d  ",  nInputs, iStop-iStart );
    printf("All%d =%10d | ", nInputs, iStop );
    printf("New%d =%8d  ",   nVars, nNew = Dau_CountFuncs(vNodSup, iStart, iStop, nVars) );
    printf("All%d =%8d  ",   nVars,        Dau_CountFuncs(vNodSup,      0, iStop, nVars) );
    printf("Two =%6d ",      Count2 );
    //Abc_PrintTime( 1, "T",   Abc_Clock() - clk );
    Abc_Print(1, "%9.2f sec\n", 1.0*(Abc_Clock() - clk)/(CLOCKS_PER_SEC));
    fflush(stdout);
    return nNew;
}